

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_2::SampleMaskWriteCase::preDraw(SampleMaskWriteCase *this)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestError *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar5;
  Hex<4UL> local_1e0;
  MessageBuilder local_1d8;
  undefined1 local_55;
  allocator<char> local_41;
  string local_40;
  undefined4 local_20;
  int local_1c;
  deUint32 mask;
  int maskLoc;
  Functions *gl;
  SampleMaskWriteCase *this_local;
  
  gl = (Functions *)this;
  pRVar4 = gles31::Context::getRenderContext
                     ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                      super_MultisampleRenderCase.super_TestCase.m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  _mask = CONCAT44(extraout_var,iVar2);
  if (*(int *)&(this->super_SampleMaskBaseCase).field_0x12c == 1) {
    pcVar1 = *(code **)(_mask + 0xb48);
    dVar3 = glu::ShaderProgram::getProgram
                      ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                       super_MultisampleRenderCase.m_program);
    local_1c = (*pcVar1)(dVar3,"u_mask");
    local_20 = 0xaaaaaaaa;
    if (local_1c == -1) {
      local_55 = 1;
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"Location of u_mask was -1",&local_41);
      tcu::TestError::TestError(this_00,&local_40);
      local_55 = 0;
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (**(code **)(_mask + 0x5e0))(0x8e51);
    (**(code **)(_mask + 0x1258))(0);
    dVar3 = (**(code **)(_mask + 0x800))();
    glu::checkError(dVar3,"set mask",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSampleVariableTests.cpp"
                    ,0x803);
    (**(code **)(_mask + 0x1500))(local_1c,0xaaaaaaaa);
    dVar3 = (**(code **)(_mask + 0x800))();
    glu::checkError(dVar3,"set mask uniform",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSampleVariableTests.cpp"
                    ,0x806);
    this_01 = tcu::TestContext::getLog
                        ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                         super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.
                         m_testCtx);
    tcu::TestLog::operator<<(&local_1d8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_1d8,(char (*) [21])"Setting sample mask ");
    tcu::Format::Hex<4UL>::Hex(&local_1e0,0xaaaaaaaa);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_1e0);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1d8);
  }
  SampleMaskBaseCase::preDraw(&this->super_SampleMaskBaseCase);
  return;
}

Assistant:

void SampleMaskWriteCase::preDraw (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_testMode == TEST_INVERSE)
	{
		// set mask to 0xAAAA.., set inverse mask bit coverage in shader

		const int		maskLoc	= gl.getUniformLocation(m_program->getProgram(), "u_mask");
		const deUint32	mask	= (deUint32)0xAAAAAAAAUL;

		if (maskLoc == -1)
			throw tcu::TestError("Location of u_mask was -1");

		gl.enable(GL_SAMPLE_MASK);
		gl.sampleMaski(0, mask);
		GLU_EXPECT_NO_ERROR(gl.getError(), "set mask");

		gl.uniform1ui(maskLoc, mask);
		GLU_EXPECT_NO_ERROR(gl.getError(), "set mask uniform");

		m_testCtx.getLog() << tcu::TestLog::Message << "Setting sample mask " << tcu::Format::Hex<4>(mask) << tcu::TestLog::EndMessage;
	}

	SampleMaskBaseCase::preDraw();
}